

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFileOpenDialog::fillListBox(CGUIFileOpenDialog *this)

{
  byte bVar1;
  uint uVar2;
  undefined4 uVar3;
  CGUIFileOpenDialog *pCVar4;
  undefined8 uVar5;
  wchar_t *pwVar6;
  long in_RDI;
  u32 i;
  stringw s;
  IGUISkin *skin;
  IReferenceCounted *in_stack_ffffffffffffff98;
  long *plVar7;
  CGUIFileOpenDialog *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint uVar8;
  CGUIFileOpenDialog *in_stack_ffffffffffffffd0;
  
  pCVar4 = (CGUIFileOpenDialog *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x60))();
  if (((*(long *)(in_RDI + 0x250) != 0) && (*(long *)(in_RDI + 0x238) != 0)) &&
     (pCVar4 != (CGUIFileOpenDialog *)0x0)) {
    if (*(long *)(in_RDI + 600) != 0) {
      IReferenceCounted::drop(in_stack_ffffffffffffff98);
    }
    (**(code **)(**(long **)(in_RDI + 0x238) + 0x160))();
    uVar5 = (**(code **)(**(long **)(in_RDI + 0x250) + 0xc0))();
    *(undefined8 *)(in_RDI + 600) = uVar5;
    core::string<wchar_t>::string((string<wchar_t> *)0x3b6ccd);
    if (*(long *)(in_RDI + 600) != 0) {
      uVar8 = 0;
      while (in_stack_ffffffffffffffcc = uVar8,
            uVar2 = (**(code **)**(undefined8 **)(in_RDI + 600))(), uVar8 < uVar2) {
        (**(code **)(**(long **)(in_RDI + 600) + 8))
                  (*(long **)(in_RDI + 600),in_stack_ffffffffffffffcc);
        pathToStringW(in_stack_ffffffffffffffa0,(stringw *)in_stack_ffffffffffffff98,
                      (path *)0x3b6d37);
        plVar7 = *(long **)(in_RDI + 0x238);
        pwVar6 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3b6d52);
        in_stack_ffffffffffffffa0 = pCVar4;
        bVar1 = (**(code **)(**(long **)(in_RDI + 600) + 0x30))
                          (*(long **)(in_RDI + 600),in_stack_ffffffffffffffcc);
        uVar5 = 0x15;
        if ((bVar1 & 1) != 0) {
          uVar5 = 0x16;
        }
        uVar3 = (**(code **)(*(long *)in_stack_ffffffffffffffa0 + 0x50))
                          (in_stack_ffffffffffffffa0,uVar5);
        (**(code **)(*plVar7 + 0x138))(plVar7,pwVar6,uVar3);
        uVar8 = in_stack_ffffffffffffffcc + 1;
      }
    }
    if (*(long *)(in_RDI + 0x240) != 0) {
      (**(code **)(**(long **)(in_RDI + 0x250) + 0x88))();
      setDirectoryName(in_stack_ffffffffffffffd0,
                       (path *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      pathToStringW(in_stack_ffffffffffffffa0,(stringw *)in_stack_ffffffffffffff98,(path *)0x3b6e08)
      ;
      plVar7 = *(long **)(in_RDI + 0x240);
      pwVar6 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3b6e22);
      (**(code **)(*plVar7 + 0xa0))(plVar7,pwVar6);
    }
    core::string<wchar_t>::~string((string<wchar_t> *)0x3b6e3c);
  }
  return;
}

Assistant:

void CGUIFileOpenDialog::fillListBox()
{
	IGUISkin *skin = Environment->getSkin();

	if (!FileSystem || !FileBox || !skin)
		return;

	if (FileList)
		FileList->drop();

	FileBox->clear();

	FileList = FileSystem->createFileList();
	core::stringw s;

	if (FileList) {
		for (u32 i = 0; i < FileList->getFileCount(); ++i) {
			pathToStringW(s, FileList->getFileName(i));
			FileBox->addItem(s.c_str(), skin->getIcon(FileList->isDirectory(i) ? EGDI_DIRECTORY : EGDI_FILE));
		}
	}

	if (FileNameText) {
		setDirectoryName(FileSystem->getWorkingDirectory());
		pathToStringW(s, FileDirectory);
		FileNameText->setText(s.c_str());
	}
}